

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  time_t expires;
  CURLcode CVar5;
  char *pcVar6;
  char date [65];
  char host [257];
  
  (*Curl_cfree)(h->filename);
  pcVar3 = (*Curl_cstrdup)(file);
  h->filename = pcVar3;
  CVar5 = CURLE_OUT_OF_MEMORY;
  if (pcVar3 != (char *)0x0) {
    __stream = fopen64(file,"r");
    if (__stream != (FILE *)0x0) {
      pcVar3 = (char *)(*Curl_cmalloc)(0xfff);
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(h->filename);
        h->filename = (char *)0x0;
        fclose(__stream);
        return CURLE_OUT_OF_MEMORY;
      }
      while (pcVar4 = Curl_get_line(pcVar3,0xfff,(FILE *)__stream), pcVar6 = pcVar3,
            pcVar4 != (char *)0x0) {
        for (; (cVar1 = *pcVar6, cVar1 == '\t' || (cVar1 == ' ')); pcVar6 = pcVar6 + 1) {
        }
        if ((cVar1 != '#') &&
           (iVar2 = __isoc99_sscanf(pcVar6,"%256s \"%64[^\"]\"",host,date), iVar2 == 2)) {
          expires = Curl_getdate_capped(date);
          hsts_create(h,host + (host[0] == '.'),host[0] == '.',expires);
        }
      }
      (*Curl_cfree)(pcVar3);
      fclose(__stream);
    }
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}